

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O0

void stringcap(luaL_Buffer *b,CapState *cs)

{
  char cVar1;
  lua_State *L;
  size_t sVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  int aiStack_1188 [2];
  Capture *apCStack_1180 [522];
  Capture *curr;
  int l;
  char *fmt;
  size_t i;
  size_t len;
  undefined1 local_108 [4];
  int n;
  StrAux cps [10];
  CapState *cs_local;
  luaL_Buffer *b_local;
  
  L = cs->L;
  cps[9].u._8_8_ = cs;
  iVar4 = updatecache(cs,(uint)cs->cap->idx);
  pcVar6 = lua_tolstring(L,iVar4,&i);
  iVar4 = getstrcaps((CapState *)cps[9].u._8_8_,(StrAux *)local_108,0);
  len._4_4_ = iVar4 + -1;
  for (fmt = (char *)0x0; fmt < i; fmt = fmt + 1) {
    if (pcVar6[(long)fmt] == '%') {
      pcVar7 = fmt + 1;
      if (((pcVar6 + 1)[(long)fmt] < '0') || ('9' < pcVar6[(long)pcVar7])) {
        if (b->size <= b->n) {
          luaL_prepbuffsize(b,1);
        }
        cVar1 = pcVar6[(long)pcVar7];
        sVar2 = b->n;
        b->n = sVar2 + 1;
        b->b[sVar2] = cVar1;
        fmt = pcVar7;
      }
      else {
        uVar5 = (int)pcVar6[(long)pcVar7] - 0x30;
        if (len._4_4_ < (int)uVar5) {
          luaL_error(*(lua_State **)(cps[9].u.s.e + 0x10),"invalid capture index (%d)",(ulong)uVar5)
          ;
          fmt = pcVar7;
        }
        else if (*(int *)(local_108 + (long)(int)uVar5 * 0x18) == 0) {
          uVar3 = *(undefined8 *)cps[9].u._8_8_;
          *(undefined8 *)cps[9].u._8_8_ = *(undefined8 *)(cps + (int)uVar5);
          iVar4 = addonestring(b,(CapState *)cps[9].u._8_8_,"capture");
          if (iVar4 == 0) {
            luaL_error(*(lua_State **)(cps[9].u.s.e + 0x10),"no values in capture index %d",
                       (ulong)uVar5);
          }
          *(undefined8 *)cps[9].u._8_8_ = uVar3;
          fmt = pcVar7;
        }
        else {
          luaL_addlstring(b,*(char **)(cps + (int)uVar5),
                          (long)cps[(int)uVar5].u.cp - *(long *)(cps + (int)uVar5));
          fmt = pcVar7;
        }
      }
    }
    else {
      if (b->size <= b->n) {
        luaL_prepbuffsize(b,1);
      }
      cVar1 = pcVar6[(long)fmt];
      sVar2 = b->n;
      b->n = sVar2 + 1;
      b->b[sVar2] = cVar1;
    }
  }
  return;
}

Assistant:

static void stringcap (luaL_Buffer *b, CapState *cs) {
  StrAux cps[MAXSTRCAPS];
  int n;
  size_t len, i;
  const char *fmt;  /* format string */
  fmt = lua_tolstring(cs->L, updatecache(cs, cs->cap->idx), &len);
  n = getstrcaps(cs, cps, 0) - 1;  /* collect nested captures */
  for (i = 0; i < len; i++) {  /* traverse them */
    if (fmt[i] != '%')  /* not an escape? */
      luaL_addchar(b, fmt[i]);  /* add it to buffer */
    else if (fmt[++i] < '0' || fmt[i] > '9')  /* not followed by a digit? */
      luaL_addchar(b, fmt[i]);  /* add to buffer */
    else {
      int l = fmt[i] - '0';  /* capture index */
      if (l > n)
        luaL_error(cs->L, "invalid capture index (%d)", l);
      else if (cps[l].isstring)
        luaL_addlstring(b, cps[l].u.s.s, cps[l].u.s.e - cps[l].u.s.s);
      else {
        Capture *curr = cs->cap;
        cs->cap = cps[l].u.cp;  /* go back to evaluate that nested capture */
        if (!addonestring(b, cs, "capture"))
          luaL_error(cs->L, "no values in capture index %d", l);
        cs->cap = curr;  /* continue from where it stopped */
      }
    }
  }
}